

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O1

bool __thiscall helics::CommsInterface::reconnect(CommsInterface *this)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  bool bVar4;
  string_view message;
  string_view message_00;
  timespec local_28;
  
  LOCK();
  (this->rxStatus)._M_i = RECONNECTING;
  UNLOCK();
  LOCK();
  (this->txStatus)._M_i = RECONNECTING;
  UNLOCK();
  (*this->_vptr_CommsInterface[9])();
  (*this->_vptr_CommsInterface[8])(this);
  iVar3 = 0;
  do {
    if ((this->rxStatus)._M_i != RECONNECTING) goto LAB_002ed29d;
    local_28.tv_sec = 0;
    local_28.tv_nsec = 50000000;
    do {
      iVar1 = nanosleep(&local_28,&local_28);
      if (iVar1 != -1) break;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 400);
  message._M_str = "unable to reconnect";
  message._M_len = 0x13;
  logError(this,message);
LAB_002ed29d:
  iVar3 = 0;
  do {
    if ((this->txStatus)._M_i != RECONNECTING) goto LAB_002ed2f6;
    local_28.tv_sec = 0;
    local_28.tv_nsec = 50000000;
    do {
      iVar1 = nanosleep(&local_28,&local_28);
      if (iVar1 != -1) break;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 400);
  message_00._M_str = "unable to reconnect";
  message_00._M_len = 0x13;
  logError(this,message_00);
LAB_002ed2f6:
  if ((this->rxStatus)._M_i == CONNECTED) {
    bVar4 = (this->txStatus)._M_i == CONNECTED;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool CommsInterface::reconnect()
{
    rxStatus = ConnectionStatus::RECONNECTING;
    txStatus = ConnectionStatus::RECONNECTING;
    reconnectReceiver();
    reconnectTransmitter();
    int cnt = 0;
    while (rxStatus.load() == ConnectionStatus::RECONNECTING) {
        std::this_thread::sleep_for(std::chrono::milliseconds(50));
        ++cnt;
        if (cnt == 400)  // Eventually give up
        {
            logError("unable to reconnect");
            break;
        }
    }
    cnt = 0;
    while (txStatus.load() == ConnectionStatus::RECONNECTING) {
        std::this_thread::sleep_for(std::chrono::milliseconds(50));
        ++cnt;
        if (cnt == 400) {
            logError("unable to reconnect");
            break;
        }
    }

    return ((rxStatus.load() == ConnectionStatus::CONNECTED) &&
            (txStatus.load() == ConnectionStatus::CONNECTED));
}